

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckyFast16.c
# Opt level: O1

int minTemp3_fast_moreThen5(word *pInOut,int iVar,int start,int finish,int iQ,int jQ,int *pDifStart)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  
  bVar1 = (byte)(iVar + -6);
  if (finish < start) {
    uVar3 = 1 << (bVar1 & 0x1f);
    iVar2 = start + -1;
    uVar4 = (ulong)uVar3;
    if ((int)uVar3 < 2) {
      uVar4 = 1;
    }
    do {
      if (iVar + -6 != 0x1f) {
        lVar6 = 0;
        do {
          iVar5 = -(uint)(pInOut[(iVar2 + lVar6) - (long)(iQ << (bVar1 & 0x1f))] <
                         pInOut[(iVar2 + lVar6) - (long)(jQ << (bVar1 & 0x1f))]);
          if (pInOut[(iVar2 + lVar6) - (long)(jQ << (bVar1 & 0x1f))] <
              pInOut[(iVar2 + lVar6) - (long)(iQ << (bVar1 & 0x1f))]) {
            iVar5 = 1;
          }
          if (iVar5 != 0) {
            iVar2 = iVar2 + 1;
            if (iVar5 == -1) goto LAB_00562258;
            iVar5 = 1;
            goto LAB_00562261;
          }
          lVar6 = lVar6 + -1;
        } while (-lVar6 != uVar4);
      }
      iVar2 = iVar2 + (-4 << (bVar1 & 0x1f));
    } while (finish <= iVar2);
  }
  iVar2 = 0;
LAB_00562258:
  iVar5 = 0;
LAB_00562261:
  *pDifStart = iVar2;
  return iVar5;
}

Assistant:

int minTemp3_fast_moreThen5(word* pInOut, int iVar, int start, int finish, int iQ, int jQ, int* pDifStart)
{
    int i, j, temp;
    int  wordBlock = 1<<(iVar-6);
    int  shiftBlock = wordBlock*4;
//    printf("in minTemp3_fast_moreThen5\n");

    for(i=start-1; i>=finish; i-=shiftBlock)
        for(j=0;j<wordBlock;j++)
        {
            temp = CompareWords(pInOut[i-j-iQ*wordBlock],pInOut[i-j-jQ*wordBlock]);
            if(temp == 0)
                continue;
            else if(temp == -1)
            {
                *pDifStart = i+1;
                return 0;
            }
            else
            {
                *pDifStart = i+1;
                return 1;
            }
        }
    *pDifStart=0;
//    printf("out minTemp3_fast_moreThen5\n");

    return 0;
}